

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

void __thiscall
LiteScript::Callback::Callback
          (Callback *this,Memory *mem,
          _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
          *cptr)

{
  size_type sVar1;
  _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
  *cptr_local;
  Memory *mem_local;
  Callback *this_local;
  
  this->call_ptr = cptr;
  this->memory = mem;
  Nullable<LiteScript::Variable>::Nullable(&this->This);
  Nullable<LiteScript::Namer>::Nullable(&this->nsp);
  this->I = &this->intrl_idx;
  this->L = &this->line_num;
  this->CallbackIndex = &this->callIndex;
  sVar1 = std::
          vector<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
          ::size(&List);
  this->callIndex = (uint)sVar1;
  std::
  vector<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
  ::push_back(&List,&this->call_ptr);
  return;
}

Assistant:

LiteScript::Callback::Callback(Memory& mem, Variable (* cptr)(State &, std::vector<Variable>&)) :
    memory(mem), call_ptr(cptr), I(intrl_idx), L(line_num), CallbackIndex(callIndex)
{
    this->callIndex = Callback::List.size();
    Callback::List.push_back(this->call_ptr);
}